

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesFanSetSpeedTableMode(zes_fan_handle_t hFan,zes_fan_speed_table_t *speedTable)

{
  zes_pfnFanSetSpeedTableMode_t pfnSetSpeedTableMode;
  dditable_t *dditable;
  ze_result_t result;
  zes_fan_speed_table_t *speedTable_local;
  zes_fan_handle_t hFan_local;
  
  if (*(code **)(*(long *)(hFan + 8) + 0xc68) == (code *)0x0) {
    hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFan_local._4_4_ = (**(code **)(*(long *)(hFan + 8) + 0xc68))(*(undefined8 *)hFan,speedTable);
  }
  return hFan_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanSetSpeedTableMode(
        zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
        const zes_fan_speed_table_t* speedTable         ///< [in] A table containing temperature/speed pairs.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_fan_object_t*>( hFan )->dditable;
        auto pfnSetSpeedTableMode = dditable->zes.Fan.pfnSetSpeedTableMode;
        if( nullptr == pfnSetSpeedTableMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFan = reinterpret_cast<zes_fan_object_t*>( hFan )->handle;

        // forward to device-driver
        result = pfnSetSpeedTableMode( hFan, speedTable );

        return result;
    }